

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# share.c
# Opt level: O0

CURLSHcode curl_share_setopt(Curl_share *share,CURLSHoption option,...)

{
  char in_AL;
  int iVar1;
  CookieInfo *pCVar2;
  curl_ssl_session *pcVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [16];
  curl_lock_function local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  CURLSHcode local_5c;
  CURLSHcode res;
  void *ptr;
  curl_unlock_function unlockfunc;
  curl_lock_function lockfunc;
  undefined4 local_38;
  int type;
  va_list param;
  CURLSHoption option_local;
  Curl_share *share_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  if (share->dirty == 0) {
    param[0].overflow_arg_area = local_118;
    param[0]._0_8_ = &stack0x00000008;
    local_100 = in_RCX;
    local_f8 = in_R8;
    local_f0 = in_R9;
    param[0].reg_save_area._4_4_ = option;
    switch(option) {
    case CURLSHOPT_SHARE:
      type = 0x30;
      local_38 = 0x18;
      local_5c = CURLSHE_OK;
      lockfunc._4_4_ = (uint)local_108;
      share->specifier = share->specifier | 1 << ((uint)local_108 & 0x1f);
      switch((uint)local_108) {
      case 2:
        if (share->cookies == (CookieInfo *)0x0) {
          local_108 = (curl_lock_function)in_RDX;
          pCVar2 = Curl_cookie_init((Curl_easy *)0x0,(char *)0x0,(CookieInfo *)0x0,true);
          share->cookies = pCVar2;
          if (share->cookies == (CookieInfo *)0x0) {
            local_5c = CURLSHE_NOMEM;
          }
        }
        break;
      case 3:
        break;
      case 4:
        if (share->sslsession == (curl_ssl_session *)0x0) {
          share->max_ssl_sessions = 8;
          local_108 = (curl_lock_function)in_RDX;
          pcVar3 = (curl_ssl_session *)(*Curl_ccalloc)(share->max_ssl_sessions,0x80);
          share->sslsession = pcVar3;
          share->sessionage = 0;
          if (share->sslsession == (curl_ssl_session *)0x0) {
            local_5c = CURLSHE_NOMEM;
          }
        }
        break;
      case 5:
        local_108 = (curl_lock_function)in_RDX;
        iVar1 = Curl_conncache_init(&share->conn_cache,0x67);
        if (iVar1 != 0) {
          local_5c = CURLSHE_NOMEM;
        }
        break;
      default:
        local_5c = CURLSHE_BAD_OPTION;
      }
      break;
    case CURLSHOPT_UNSHARE:
      type = 0x30;
      local_38 = 0x18;
      local_5c = CURLSHE_OK;
      lockfunc._4_4_ = (uint)local_108;
      share->specifier = share->specifier & ~(1 << ((uint)local_108 & 0x1f));
      switch((uint)local_108) {
      case 2:
        if (share->cookies != (CookieInfo *)0x0) {
          local_108 = (curl_lock_function)in_RDX;
          Curl_cookie_cleanup(share->cookies);
          share->cookies = (CookieInfo *)0x0;
        }
        break;
      case 3:
        break;
      case 4:
        local_108 = (curl_lock_function)in_RDX;
        (*Curl_cfree)(share->sslsession);
        share->sslsession = (curl_ssl_session *)0x0;
        break;
      case 5:
        break;
      default:
        local_5c = CURLSHE_BAD_OPTION;
      }
      break;
    case CURLSHOPT_LOCKFUNC:
      local_5c = CURLSHE_OK;
      share->lockfunc = local_108;
      break;
    case CURLSHOPT_UNLOCKFUNC:
      local_5c = CURLSHE_OK;
      share->unlockfunc = (curl_unlock_function)local_108;
      break;
    case CURLSHOPT_USERDATA:
      local_5c = CURLSHE_OK;
      share->clientdata = local_108;
      break;
    default:
      local_5c = CURLSHE_BAD_OPTION;
    }
    share_local._4_4_ = local_5c;
  }
  else {
    share_local._4_4_ = CURLSHE_IN_USE;
  }
  return share_local._4_4_;
}

Assistant:

CURLSHcode
curl_share_setopt(struct Curl_share *share, CURLSHoption option, ...)
{
  va_list param;
  int type;
  curl_lock_function lockfunc;
  curl_unlock_function unlockfunc;
  void *ptr;
  CURLSHcode res = CURLSHE_OK;

  if(share->dirty)
    /* don't allow setting options while one or more handles are already
       using this share */
    return CURLSHE_IN_USE;

  va_start(param, option);

  switch(option) {
  case CURLSHOPT_SHARE:
    /* this is a type this share will share */
    type = va_arg(param, int);
    share->specifier |= (1<<type);
    switch(type) {
    case CURL_LOCK_DATA_DNS:
      break;

    case CURL_LOCK_DATA_COOKIE:
#if !defined(CURL_DISABLE_HTTP) && !defined(CURL_DISABLE_COOKIES)
      if(!share->cookies) {
        share->cookies = Curl_cookie_init(NULL, NULL, NULL, TRUE);
        if(!share->cookies)
          res = CURLSHE_NOMEM;
      }
#else   /* CURL_DISABLE_HTTP */
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_SSL_SESSION:
#ifdef USE_SSL
      if(!share->sslsession) {
        share->max_ssl_sessions = 8;
        share->sslsession = calloc(share->max_ssl_sessions,
                                   sizeof(struct curl_ssl_session));
        share->sessionage = 0;
        if(!share->sslsession)
          res = CURLSHE_NOMEM;
      }
#else
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_CONNECT:     /* not supported (yet) */
      if(Curl_conncache_init(&share->conn_cache, 103))
        res = CURLSHE_NOMEM;
      break;

    default:
      res = CURLSHE_BAD_OPTION;
    }
    break;

  case CURLSHOPT_UNSHARE:
    /* this is a type this share will no longer share */
    type = va_arg(param, int);
    share->specifier &= ~(1<<type);
    switch(type) {
    case CURL_LOCK_DATA_DNS:
      break;

    case CURL_LOCK_DATA_COOKIE:
#if !defined(CURL_DISABLE_HTTP) && !defined(CURL_DISABLE_COOKIES)
      if(share->cookies) {
        Curl_cookie_cleanup(share->cookies);
        share->cookies = NULL;
      }
#else   /* CURL_DISABLE_HTTP */
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_SSL_SESSION:
#ifdef USE_SSL
      Curl_safefree(share->sslsession);
#else
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_CONNECT:
      break;

    default:
      res = CURLSHE_BAD_OPTION;
      break;
    }
    break;

  case CURLSHOPT_LOCKFUNC:
    lockfunc = va_arg(param, curl_lock_function);
    share->lockfunc = lockfunc;
    break;

  case CURLSHOPT_UNLOCKFUNC:
    unlockfunc = va_arg(param, curl_unlock_function);
    share->unlockfunc = unlockfunc;
    break;

  case CURLSHOPT_USERDATA:
    ptr = va_arg(param, void *);
    share->clientdata = ptr;
    break;

  default:
    res = CURLSHE_BAD_OPTION;
    break;
  }

  va_end(param);

  return res;
}